

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParsingTests.cpp
# Opt level: O2

void testPostfixUnary(TokenKind kind)

{
  ITransientExpression IVar1;
  __type_conflict4 _Var2;
  SyntaxNode *this;
  SourceManager *sourceManager;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  TokenKind kind_local;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_a8;
  string local_98;
  undefined1 local_78 [8];
  undefined8 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  string *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text;
  
  kind_local = kind;
  _local_78 = (ITransientExpression)slang::parsing::LexerFacts::getTokenKindText(kind);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&catchAssertionHandler,
             (basic_string_view<char,_std::char_traits<char>_> *)local_78,
             (allocator<char> *)&local_98);
  std::operator+(&text,"a",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &catchAssertionHandler);
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  this = &parseExpression(&text)->super_SyntaxNode;
  local_70 = (char *)0x91;
  local_78 = (undefined1  [8])
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
  ;
  capturedExpression.m_size = 0x39;
  capturedExpression.m_start = "expr.kind == SyntaxFacts::getUnaryPostfixExpression(kind)";
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_78,capturedExpression,Normal);
  local_98._M_dataplus._M_p._0_4_ = slang::syntax::SyntaxFacts::getUnaryPostfixExpression(kind);
  IVar1 = _local_78;
  local_70._0_1_ = true;
  local_70._2_6_ = IVar1._10_6_;
  local_70._1_1_ = this->kind == (SyntaxKind)local_98._M_dataplus._M_p;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b653c8;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_68._M_allocated_capacity = (size_type)this;
  local_50 = &local_98;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_70 = (char *)0x92;
  local_78 = (undefined1  [8])
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
  ;
  capturedExpression_00.m_size = 0x17;
  capturedExpression_00.m_start = "expr.toString() == text";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_78,capturedExpression_00,
             ContinueOnFailure);
  slang::syntax::SyntaxNode::toString_abi_cxx11_(&local_98,this);
  _Var2 = std::operator==(&local_98,&text);
  IVar1 = _local_78;
  local_70._0_1_ = true;
  local_70._2_6_ = IVar1._10_6_;
  local_70._1_1_ = _Var2;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b653f8;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_68._M_allocated_capacity = (size_type)&local_98;
  local_50 = &text;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  sourceManager = getSourceManager();
  slang::Diagnostics::sort((Diagnostics *)&slang::diagnostics,sourceManager);
  if (DAT_00b8c868 != 0) {
    local_78 = (undefined1  [8])0x888d78;
    local_70 = (char *)0x93;
    macroName_01.m_size = 10;
    macroName_01.m_start = "FAIL_CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_78,
               (StringRef)ZEXT816(0x88e35c),ContinueOnFailure);
    local_a8.m_index = 0;
    local_a8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_a8);
    reportGlobalDiags_abi_cxx11_();
    std::operator<<(local_a8.m_oss,(string *)&local_98);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_78,&local_a8);
    Catch::AssertionHandler::handleMessage
              (&catchAssertionHandler,ExplicitFailure,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_98);
    Catch::ReusableStringStream::~ReusableStringStream(&local_a8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  local_70 = (char *)0x95;
  local_78 = (undefined1  [8])
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
  ;
  capturedExpression_01.m_size = 0x1d;
  capturedExpression_01.m_start = "us.operatorToken.kind == kind";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_78,capturedExpression_01,
             ContinueOnFailure);
  IVar1 = _local_78;
  local_68._M_allocated_capacity = (size_type)&this[3].previewNode;
  local_50 = (string *)&kind_local;
  local_70._0_1_ = true;
  local_70._2_6_ = IVar1._10_6_;
  local_70._1_1_ = *(TokenKind *)&this[3].previewNode == kind_local;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b65428;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_70 = (char *)0x96;
  local_78 = (undefined1  [8])
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
  ;
  capturedExpression_02.m_size = 0x2e;
  capturedExpression_02.m_start = "us.operand->kind == SyntaxKind::IdentifierName";
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_78,capturedExpression_02,
             ContinueOnFailure);
  IVar1 = _local_78;
  local_68._M_allocated_capacity = *(undefined8 *)(this + 1);
  local_98._M_dataplus._M_p._0_4_ = 0xe5;
  local_70._0_1_ = true;
  local_70._2_6_ = IVar1._10_6_;
  local_70._1_1_ = *(int *)local_68._M_allocated_capacity == 0xe5;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b65458;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_50 = &local_98;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&text);
  return;
}

Assistant:

void testPostfixUnary(TokenKind kind) {
    auto text = "a" + std::string(LF::getTokenKindText(kind));
    auto& expr = parseExpression(text);

    REQUIRE(expr.kind == SyntaxFacts::getUnaryPostfixExpression(kind));
    CHECK(expr.toString() == text);
    CHECK_DIAGNOSTICS_EMPTY;
    auto& us = expr.as<PostfixUnaryExpressionSyntax>();
    CHECK(us.operatorToken.kind == kind);
    CHECK(us.operand->kind == SyntaxKind::IdentifierName);
}